

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_choice.hpp
# Opt level: O0

bool bcl::detail::check_table<std::vector<double,std::allocator<double>>,unsigned_int,unsigned_int>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *table,double tol)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar5;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  uint j;
  double p;
  uint i;
  double nm;
  double norm;
  bool r;
  size_t m;
  size_t n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff80;
  uint local_64;
  uint local_54;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  sVar3 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::size(in_RSI);
  bVar1 = true;
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
  std::
  accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::numeric_limits<unsigned_int>::max();
  for (local_54 = 0; local_54 < sVar2; local_54 = local_54 + 1) {
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::operator[](in_RSI,(ulong)local_54);
    for (local_64 = 0; local_64 < sVar3; local_64 = local_64 + 1) {
      pvVar4 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator[](in_RSI,(ulong)local_64);
      if (pvVar4->second == local_54) {
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator[](in_RSI,(ulong)local_64);
      }
    }
    pvVar5 = in_RDI;
    std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_54);
    std::abs((int)pvVar5);
    bVar1 = (bool)(bVar1 & extraout_XMM0_Qa <
                           in_XMM0_Qa *
                           ((auVar6._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  }
  return bVar1;
}

Assistant:

inline bool check_table(WVEC const& weights,
  std::vector<std::pair<CutoffType, IndexType> > const& table, double tol = 1.0e-10) {
  std::size_t n = weights.size();
  std::size_t m = table.size();
  bool r = true;
  tol *= n;
  double norm = m / std::accumulate(weights.begin(), weights.end(), double(0));
  double nm = 1;
  if (std::is_integral<CutoffType>::value) nm /= std::numeric_limits<CutoffType>::max();
  for (IndexType i = 0; i < n; ++i) {
    double p = nm * table[i].first;
    for (IndexType j = 0; j < m; ++j)
      if (table[j].second == i) p += (1.0 - nm * table[j].first);
    r &= std::abs(p - norm * weights[i]) < tol;
  }
  return r;
}